

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

LegacyScriptPubKeyMan * wallet::EnsureLegacyScriptPubKeyMan(CWallet *wallet,bool also_create)

{
  long lVar1;
  undefined8 uVar2;
  byte in_SIL;
  string *in_RDI;
  long in_FS_OFFSET;
  LegacyScriptPubKeyMan *spk_man;
  CWallet *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  LegacyScriptPubKeyMan *local_48;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = CWallet::GetLegacyScriptPubKeyMan
                       ((CWallet *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((local_48 == (LegacyScriptPubKeyMan *)0x0) && ((in_SIL & 1) != 0)) {
    local_48 = CWallet::GetOrCreateLegacyScriptPubKeyMan(in_stack_ffffffffffffff98);
  }
  if (local_48 == (LegacyScriptPubKeyMan *)0x0) {
    uVar2 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               in_stack_ffffffffffffffd0,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffffdc,in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

LegacyScriptPubKeyMan& EnsureLegacyScriptPubKeyMan(CWallet& wallet, bool also_create)
{
    LegacyScriptPubKeyMan* spk_man = wallet.GetLegacyScriptPubKeyMan();
    if (!spk_man && also_create) {
        spk_man = wallet.GetOrCreateLegacyScriptPubKeyMan();
    }
    if (!spk_man) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Only legacy wallets are supported by this command");
    }
    return *spk_man;
}